

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O2

string * llbuild::commands::util::escapedString_abi_cxx11_(StringRef str)

{
  byte C;
  int iVar1;
  raw_ostream *this;
  raw_string_ostream *this_00;
  ulong in_RDX;
  byte bVar2;
  char C_00;
  char *Str;
  string *in_RDI;
  uint uVar3;
  raw_string_ostream resultStream;
  StringRef local_70;
  raw_string_ostream local_60;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  local_60.super_raw_ostream.BufferMode = InternalBuffer;
  local_60.super_raw_ostream.OutBufStart = (char *)0x0;
  local_60.super_raw_ostream.OutBufEnd = (char *)0x0;
  local_60.super_raw_ostream.OutBufCur = (char *)0x0;
  local_60.super_raw_ostream._vptr_raw_ostream = (_func_int **)&PTR__raw_string_ostream_00204248;
  uVar3 = 0;
  local_70.Length = in_RDX;
  do {
    if (local_70.Length <= uVar3) {
      llvm::raw_ostream::flush(&local_60.super_raw_ostream);
      llvm::raw_string_ostream::~raw_string_ostream(&local_60);
      return in_RDI;
    }
    C = llvm::StringRef::operator[](&local_70,(ulong)uVar3);
    if (C == 0x22) {
      Str = "\\\"";
LAB_0011b317:
      llvm::raw_ostream::operator<<(&local_60.super_raw_ostream,Str);
    }
    else {
      iVar1 = isprint((int)(char)C);
      this_00 = &local_60;
      if (iVar1 == 0) {
        if (C == 10) {
          Str = "\\n";
          goto LAB_0011b317;
        }
        this = llvm::raw_ostream::operator<<(&local_60.super_raw_ostream,"\\x");
        C_00 = (C >> 4) + 0x37;
        if (C < 0xa0) {
          C_00 = (C >> 4) + 0x30;
        }
        this_00 = (raw_string_ostream *)llvm::raw_ostream::operator<<(this,C_00);
        bVar2 = C & 0xf;
        C = bVar2 + 0x37;
        if (bVar2 < 10) {
          C = bVar2 + 0x30;
        }
      }
      llvm::raw_ostream::operator<<(&this_00->super_raw_ostream,C);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string util::escapedString(StringRef str) {
  std::string result;
  llvm::raw_string_ostream resultStream(result);
  for (unsigned i = 0; i < str.size(); ++i) {
    char c = str[i];
    if (c == '"') {
      resultStream << "\\\"";
    } else if (isprint(c)) {
      resultStream << c;
    } else if (c == '\n') {
      resultStream << "\\n";
    } else {
      resultStream << "\\x"
             << hexdigit(((unsigned char) c >> 4) & 0xF)
             << hexdigit((unsigned char) c & 0xF);
    }
  }
  resultStream.flush();
  return result;
}